

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O1

void rw::writeTGA(Image *image,char *filename)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  undefined4 extraout_var;
  byte *pbVar3;
  char *pcVar4;
  size_t __n;
  ushort uVar5;
  int iVar6;
  StreamFile *pSVar7;
  ulong uVar8;
  uint8 *puVar9;
  byte *pbVar10;
  bool bVar11;
  StreamFile file;
  Error _e;
  TGAHeader header;
  byte *local_68;
  StreamFile local_60;
  Error local_4c;
  TGAHeader local_44;
  
  local_60.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00148ca0;
  local_60.file = (FILE *)0x0;
  iVar2 = StreamFile::open(&local_60,filename,0x134f25);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_4c.plugin = 0;
    local_4c.code = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/tga.cpp",
            0xa1);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000003,filename);
    fprintf(__stream,"%s\n",pcVar4);
    setError(&local_4c);
  }
  else {
    local_44.IDlen = '\0';
    puVar9 = image->palette;
    bVar11 = puVar9 == (uint8 *)0x0;
    local_44.colorMapType = !bVar11;
    local_44.imageType = bVar11 + '\x01';
    local_44.colorMapOrigin = 0;
    uVar1 = image->depth;
    local_44.colorMapDepth = !bVar11 << 5;
    uVar5 = 0x10;
    if (uVar1 != 4) {
      uVar5 = (ushort)(uVar1 == 8) << 8;
    }
    local_44.xOrigin = 0;
    local_44.yOrigin = 0;
    local_44.width = (int16)image->width;
    local_44.height = (int16)image->height;
    __n = 8;
    if (uVar1 != 4) {
      __n = (size_t)uVar1;
    }
    local_44.depth = (uint8)__n;
    local_44.descriptor = (uVar1 == 0x20) << 3 | 0x20;
    pSVar7 = &local_60;
    local_44.colorMapLength = uVar5;
    TGAHeader::write(&local_44,(int)pSVar7,(void *)((ulong)(uVar1 == 8) << 8),__n);
    if (puVar9 == (uint8 *)0x0) {
      puVar9 = (uint8 *)0x0;
    }
    else {
      puVar9 = image->palette;
    }
    if (uVar5 != 0 && puVar9 != (uint8 *)0x0) {
      uVar8 = 0;
      do {
        Stream::writeU8(&local_60.super_Stream,puVar9[uVar8 * 4 + 2]);
        Stream::writeU8(&local_60.super_Stream,puVar9[uVar8 * 4 + 1]);
        Stream::writeU8(&local_60.super_Stream,puVar9[uVar8 * 4]);
        pSVar7 = (StreamFile *)(ulong)puVar9[uVar8 * 4 + 3];
        Stream::writeU8(&local_60.super_Stream,puVar9[uVar8 * 4 + 3]);
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    iVar2 = (int)pSVar7;
    if (0 < image->height) {
      local_68 = image->pixels;
      iVar6 = 0;
      do {
        if (0 < image->width) {
          iVar2 = 0;
          pbVar10 = local_68;
          do {
            pbVar3 = pbVar10;
            switch(image->depth << 0x1e | image->depth - 4U >> 2) {
            case 0:
            case 1:
              break;
            default:
              goto switchD_001124fc_caseD_2;
            case 3:
              Stream::writeU8(&local_60.super_Stream,*pbVar10);
              pbVar3 = pbVar10 + 1;
              break;
            case 5:
              Stream::writeU8(&local_60.super_Stream,pbVar10[2]);
              Stream::writeU8(&local_60.super_Stream,pbVar10[1]);
              break;
            case 7:
              Stream::writeU8(&local_60.super_Stream,pbVar10[2]);
              Stream::writeU8(&local_60.super_Stream,pbVar10[1]);
              Stream::writeU8(&local_60.super_Stream,*pbVar10);
              pbVar3 = pbVar10 + 3;
            }
            pSVar7 = (StreamFile *)(ulong)*pbVar3;
            Stream::writeU8(&local_60.super_Stream,*pbVar3);
switchD_001124fc_caseD_2:
            pbVar10 = pbVar10 + image->bpp;
            iVar2 = iVar2 + 1;
          } while (iVar2 < image->width);
        }
        iVar2 = (int)pSVar7;
        local_68 = local_68 + image->stride;
        iVar6 = iVar6 + 1;
      } while (iVar6 < image->height);
    }
    StreamFile::close(&local_60,iVar2);
  }
  return;
}

Assistant:

void
writeTGA(Image *image, const char *filename)
{
	TGAHeader header;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}
	header.IDlen = 0;
	header.imageType = image->palette != nil ? 1 : 2;
	header.colorMapType = image->palette != nil;
	header.colorMapOrigin = 0;
	header.colorMapLength = image->depth == 4 ? 16 :
	                        image->depth == 8 ? 256 : 0;
	header.colorMapDepth = image->palette ? 32 : 0;
	header.xOrigin = 0;
	header.yOrigin = 0;
	header.width = image->width;
	header.height = image->height;
	header.depth = image->depth == 4 ? 8 : image->depth;
	header.descriptor = 0x20 | (image->depth == 32 ? 8 : 0);
	header.write(&file);

	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = (uint8(*)[4])palette;;
	if(palette)
		for(int i = 0; i < header.colorMapLength; i++){
			file.writeU8(color[i][2]);
			file.writeU8(color[i][1]);
			file.writeU8(color[i][0]);
			file.writeU8(color[i][3]);
		}

	uint8 *line = image->pixels;
	uint8 *p;
	for(int y = 0; y < image->height; y++){
		p = line;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				file.writeU8(p[0]);
				break;
			case 16:
				file.writeU8(p[0]);
				file.writeU8(p[1]);
				break;
			case 24:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				break;
			case 32:
				file.writeU8(p[2]);
				file.writeU8(p[1]);
				file.writeU8(p[0]);
				file.writeU8(p[3]);
				break;
			}
			p += image->bpp;
		}
		line += image->stride;
	}
	file.close();
}